

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float in_register_000012dc;
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  float fVar44;
  undefined1 auVar43 [32];
  float in_register_0000135c;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [32];
  float in_register_0000145c;
  undefined1 auVar53 [32];
  float in_register_0000149c;
  
  pBVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices.
           items;
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68);
  lVar23 = uVar2 * sVar5;
  fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          maxRadiusScale;
  auVar33 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar23 + 0xc))),
                        ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar23 + 0xc))),0);
  lVar21 = (uVar2 + 1) * sVar5;
  fVar12 = auVar33._0_4_;
  fVar13 = auVar33._4_4_;
  fVar44 = auVar33._8_4_;
  fVar16 = auVar33._12_4_;
  auVar33 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar21 + 0xc))),
                        ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar21 + 0xc))),0);
  fVar32 = auVar33._0_4_;
  fVar37 = auVar33._4_4_;
  fVar38 = auVar33._8_4_;
  fVar39 = auVar33._12_4_;
  lVar24 = (uVar2 + 2) * sVar5;
  auVar33 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar24 + 0xc))),
                        ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar24 + 0xc))),0);
  fVar48 = auVar33._0_4_;
  fVar50 = auVar33._4_4_;
  fVar51 = auVar33._8_4_;
  fVar52 = auVar33._12_4_;
  lVar22 = (uVar2 + 3) * sVar5;
  auVar33 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar22 + 0xc))),
                        ZEXT416((uint)(fVar1 * *(float *)(pcVar4 + lVar22 + 0xc))),0);
  fVar1 = auVar33._0_4_;
  fVar14 = auVar33._4_4_;
  fVar15 = auVar33._8_4_;
  fVar17 = auVar33._12_4_;
  auVar45._0_4_ =
       (float)bezier_basis0._476_4_ * fVar12 +
       fVar48 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar1 +
       fVar32 * (float)bezier_basis0._1632_4_;
  auVar45._4_4_ =
       (float)bezier_basis0._480_4_ * fVar13 +
       fVar50 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar14 +
       fVar37 * (float)bezier_basis0._1636_4_;
  auVar45._8_4_ =
       (float)bezier_basis0._484_4_ * fVar44 +
       fVar51 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar15 +
       fVar38 * (float)bezier_basis0._1640_4_;
  auVar45._12_4_ =
       (float)bezier_basis0._488_4_ * fVar16 +
       fVar52 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar17 +
       fVar39 * (float)bezier_basis0._1644_4_;
  auVar45._16_4_ =
       (float)bezier_basis0._492_4_ * fVar12 +
       fVar48 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar1 +
       fVar32 * (float)bezier_basis0._1648_4_;
  auVar45._20_4_ =
       (float)bezier_basis0._496_4_ * fVar13 +
       fVar50 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar14 +
       fVar37 * (float)bezier_basis0._1652_4_;
  auVar45._24_4_ =
       (float)bezier_basis0._500_4_ * fVar44 +
       fVar51 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar15 +
       fVar38 * (float)bezier_basis0._1656_4_;
  auVar45._28_4_ =
       in_register_000012dc + in_register_0000145c + in_register_0000149c + in_register_0000135c;
  auVar40._8_4_ = 0xff800000;
  auVar40._0_8_ = 0xff800000ff800000;
  auVar40._12_4_ = 0xff800000;
  auVar40._16_4_ = 0xff800000;
  auVar40._20_4_ = 0xff800000;
  auVar40._24_4_ = 0xff800000;
  auVar40._28_4_ = 0xff800000;
  auVar8 = vmaxps_avx(auVar40,auVar45);
  auVar25._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar12 +
       (float)bezier_basis0._6256_4_ * fVar32 +
       fVar48 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar1;
  auVar25._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar13 +
       (float)bezier_basis0._6260_4_ * fVar37 +
       fVar50 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar14;
  auVar25._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar44 +
       (float)bezier_basis0._6264_4_ * fVar38 +
       fVar51 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar15;
  auVar25._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar16 +
       (float)bezier_basis0._6268_4_ * fVar39 +
       fVar52 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar17;
  auVar25._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar12 +
       (float)bezier_basis0._6272_4_ * fVar32 +
       fVar48 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar1;
  auVar25._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar13 +
       (float)bezier_basis0._6276_4_ * fVar37 +
       fVar50 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar14;
  auVar25._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar44 +
       (float)bezier_basis0._6280_4_ * fVar38 +
       fVar51 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar15;
  auVar25._28_4_ = fVar16 + fVar39 + fVar52 + fVar17;
  auVar33 = ZEXT816(0) << 0x40;
  auVar28 = vblendps_avx(auVar25,ZEXT1632(auVar33),1);
  auVar9._4_4_ = auVar28._4_4_ * 0.055555556;
  auVar9._0_4_ = auVar28._0_4_ * 0.055555556;
  auVar9._8_4_ = auVar28._8_4_ * 0.055555556;
  auVar9._12_4_ = auVar28._12_4_ * 0.055555556;
  auVar9._16_4_ = auVar28._16_4_ * 0.055555556;
  auVar9._20_4_ = auVar28._20_4_ * 0.055555556;
  auVar9._24_4_ = auVar28._24_4_ * 0.055555556;
  auVar9._28_4_ = auVar28._28_4_;
  auVar40 = vsubps_avx(auVar45,auVar9);
  auVar28 = vblendps_avx(auVar25,ZEXT1632(auVar33),0x80);
  auVar26._0_4_ = auVar45._0_4_ + auVar28._0_4_ * 0.055555556;
  auVar26._4_4_ = auVar45._4_4_ + auVar28._4_4_ * 0.055555556;
  auVar26._8_4_ = auVar45._8_4_ + auVar28._8_4_ * 0.055555556;
  auVar26._12_4_ = auVar45._12_4_ + auVar28._12_4_ * 0.055555556;
  auVar26._16_4_ = auVar45._16_4_ + auVar28._16_4_ * 0.055555556;
  auVar26._20_4_ = auVar45._20_4_ + auVar28._20_4_ * 0.055555556;
  auVar26._24_4_ = auVar45._24_4_ + auVar28._24_4_ * 0.055555556;
  auVar26._28_4_ = auVar45._28_4_ + auVar28._28_4_;
  auVar28 = vmaxps_avx(auVar40,auVar26);
  fVar1 = *(float *)(pcVar4 + lVar24 + 8);
  auVar9 = vmaxps_avx(auVar8,auVar28);
  fVar12 = *(float *)(pcVar4 + lVar22 + 8);
  fVar13 = *(float *)(pcVar4 + lVar21 + 8);
  fVar14 = *(float *)(pcVar4 + lVar23 + 8);
  auVar31._0_4_ =
       (float)bezier_basis0._476_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar1 + (float)bezier_basis0._3944_4_ * fVar12;
  auVar31._4_4_ =
       (float)bezier_basis0._480_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar1 + (float)bezier_basis0._3948_4_ * fVar12;
  auVar31._8_4_ =
       (float)bezier_basis0._484_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar1 + (float)bezier_basis0._3952_4_ * fVar12;
  auVar31._12_4_ =
       (float)bezier_basis0._488_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar1 + (float)bezier_basis0._3956_4_ * fVar12;
  auVar31._16_4_ =
       (float)bezier_basis0._492_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar1 + (float)bezier_basis0._3960_4_ * fVar12;
  auVar31._20_4_ =
       (float)bezier_basis0._496_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar1 + (float)bezier_basis0._3964_4_ * fVar12;
  auVar31._24_4_ =
       (float)bezier_basis0._500_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar1 + (float)bezier_basis0._3968_4_ * fVar12;
  auVar31._28_4_ = auVar45._28_4_ + auVar40._28_4_ + auVar9._28_4_ + auVar40._28_4_;
  auVar27._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar1 + (float)bezier_basis0._8568_4_ * fVar12;
  auVar27._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar1 + (float)bezier_basis0._8572_4_ * fVar12;
  auVar27._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar1 + (float)bezier_basis0._8576_4_ * fVar12;
  auVar27._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * fVar1 + (float)bezier_basis0._8580_4_ * fVar12;
  auVar27._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar1 + (float)bezier_basis0._8584_4_ * fVar12;
  auVar27._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar1 + (float)bezier_basis0._8588_4_ * fVar12;
  auVar27._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar1 + (float)bezier_basis0._8592_4_ * fVar12;
  auVar27._28_4_ = fVar14 + fVar12 + fVar1 + fVar12;
  auVar28 = vblendps_avx(auVar27,ZEXT1632(auVar33),1);
  auVar8._4_4_ = auVar28._4_4_ * 0.055555556;
  auVar8._0_4_ = auVar28._0_4_ * 0.055555556;
  auVar8._8_4_ = auVar28._8_4_ * 0.055555556;
  auVar8._12_4_ = auVar28._12_4_ * 0.055555556;
  auVar8._16_4_ = auVar28._16_4_ * 0.055555556;
  auVar8._20_4_ = auVar28._20_4_ * 0.055555556;
  auVar8._24_4_ = auVar28._24_4_ * 0.055555556;
  auVar8._28_4_ = auVar28._28_4_;
  auVar19 = vsubps_avx(auVar31,auVar8);
  auVar28 = vblendps_avx(auVar27,ZEXT1632(auVar33),0x80);
  auVar34._0_4_ = auVar31._0_4_ + auVar28._0_4_ * 0.055555556;
  auVar34._4_4_ = auVar31._4_4_ + auVar28._4_4_ * 0.055555556;
  auVar34._8_4_ = auVar31._8_4_ + auVar28._8_4_ * 0.055555556;
  auVar34._12_4_ = auVar31._12_4_ + auVar28._12_4_ * 0.055555556;
  auVar34._16_4_ = auVar31._16_4_ + auVar28._16_4_ * 0.055555556;
  auVar34._20_4_ = auVar31._20_4_ + auVar28._20_4_ * 0.055555556;
  auVar34._24_4_ = auVar31._24_4_ + auVar28._24_4_ * 0.055555556;
  auVar34._28_4_ = auVar31._28_4_ + auVar28._28_4_;
  auVar28._8_4_ = 0xff800000;
  auVar28._0_8_ = 0xff800000ff800000;
  auVar28._12_4_ = 0xff800000;
  auVar28._16_4_ = 0xff800000;
  auVar28._20_4_ = 0xff800000;
  auVar28._24_4_ = 0xff800000;
  auVar28._28_4_ = 0xff800000;
  auVar28 = vmaxps_avx(auVar28,auVar31);
  auVar8 = vmaxps_avx(auVar19,auVar34);
  auVar25 = vmaxps_avx(auVar28,auVar8);
  fVar1 = *(float *)(pcVar4 + lVar24 + 4);
  fVar12 = *(float *)(pcVar4 + lVar22 + 4);
  fVar14 = *(float *)(pcVar4 + lVar21 + 4);
  fVar44 = *(float *)(pcVar4 + lVar23 + 4);
  auVar29._0_4_ =
       fVar44 * (float)bezier_basis0._476_4_ +
       fVar14 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar1 + (float)bezier_basis0._3944_4_ * fVar12;
  auVar29._4_4_ =
       fVar44 * (float)bezier_basis0._480_4_ +
       fVar14 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar1 + (float)bezier_basis0._3948_4_ * fVar12;
  auVar29._8_4_ =
       fVar44 * (float)bezier_basis0._484_4_ +
       fVar14 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar1 + (float)bezier_basis0._3952_4_ * fVar12;
  auVar29._12_4_ =
       fVar44 * (float)bezier_basis0._488_4_ +
       fVar14 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar1 + (float)bezier_basis0._3956_4_ * fVar12;
  auVar29._16_4_ =
       fVar44 * (float)bezier_basis0._492_4_ +
       fVar14 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar1 + (float)bezier_basis0._3960_4_ * fVar12;
  auVar29._20_4_ =
       fVar44 * (float)bezier_basis0._496_4_ +
       fVar14 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar1 + (float)bezier_basis0._3964_4_ * fVar12;
  auVar29._24_4_ =
       fVar44 * (float)bezier_basis0._500_4_ +
       fVar14 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar1 + (float)bezier_basis0._3968_4_ * fVar12;
  auVar29._28_4_ = fVar13 + auVar25._28_4_ + auVar45._28_4_ + 0.0;
  auVar35._0_4_ =
       fVar44 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar14 +
       (float)bezier_basis0._7412_4_ * fVar1 + (float)bezier_basis0._8568_4_ * fVar12;
  auVar35._4_4_ =
       fVar44 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar14 +
       (float)bezier_basis0._7416_4_ * fVar1 + (float)bezier_basis0._8572_4_ * fVar12;
  auVar35._8_4_ =
       fVar44 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar14 +
       (float)bezier_basis0._7420_4_ * fVar1 + (float)bezier_basis0._8576_4_ * fVar12;
  auVar35._12_4_ =
       fVar44 * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * fVar14 +
       (float)bezier_basis0._7424_4_ * fVar1 + (float)bezier_basis0._8580_4_ * fVar12;
  auVar35._16_4_ =
       fVar44 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar14 +
       (float)bezier_basis0._7428_4_ * fVar1 + (float)bezier_basis0._8584_4_ * fVar12;
  auVar35._20_4_ =
       fVar44 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar14 +
       (float)bezier_basis0._7432_4_ * fVar1 + (float)bezier_basis0._8588_4_ * fVar12;
  auVar35._24_4_ =
       fVar44 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar14 +
       (float)bezier_basis0._7436_4_ * fVar1 + (float)bezier_basis0._8592_4_ * fVar12;
  auVar35._28_4_ = fVar12 + fVar12 + fVar1 + fVar12;
  auVar28 = vblendps_avx(auVar35,ZEXT832(0) << 0x20,1);
  auVar10._4_4_ = auVar28._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar28._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar28._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar28._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar28._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar28._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar28._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar28._28_4_;
  auVar27 = vsubps_avx(auVar29,auVar10);
  auVar28 = vblendps_avx(auVar35,ZEXT832(0) << 0x20,0x80);
  auVar36._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.055555556;
  auVar36._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.055555556;
  auVar36._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.055555556;
  auVar36._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.055555556;
  auVar36._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.055555556;
  auVar36._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.055555556;
  auVar36._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.055555556;
  auVar36._28_4_ = auVar29._28_4_ + auVar28._28_4_;
  auVar42._8_4_ = 0xff800000;
  auVar42._0_8_ = 0xff800000ff800000;
  auVar42._12_4_ = 0xff800000;
  auVar42._16_4_ = 0xff800000;
  auVar42._20_4_ = 0xff800000;
  auVar42._24_4_ = 0xff800000;
  auVar42._28_4_ = 0xff800000;
  auVar28 = vmaxps_avx(auVar42,auVar29);
  auVar8 = vmaxps_avx(auVar27,auVar36);
  auVar10 = vmaxps_avx(auVar28,auVar8);
  fVar1 = *(float *)(pcVar4 + lVar24);
  fVar12 = *(float *)(pcVar4 + lVar22);
  fVar13 = *(float *)(pcVar4 + lVar21);
  fVar44 = (float)bezier_basis0._1660_4_ + auVar8._28_4_ + -INFINITY;
  fVar14 = *(float *)(pcVar4 + lVar23);
  auVar47._0_4_ =
       fVar14 * (float)bezier_basis0._476_4_ +
       fVar13 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar1 + fVar12 * (float)bezier_basis0._3944_4_;
  auVar47._4_4_ =
       fVar14 * (float)bezier_basis0._480_4_ +
       fVar13 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar1 + fVar12 * (float)bezier_basis0._3948_4_;
  auVar47._8_4_ =
       fVar14 * (float)bezier_basis0._484_4_ +
       fVar13 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar1 + fVar12 * (float)bezier_basis0._3952_4_;
  auVar47._12_4_ =
       fVar14 * (float)bezier_basis0._488_4_ +
       fVar13 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar1 + fVar12 * (float)bezier_basis0._3956_4_;
  auVar47._16_4_ =
       fVar14 * (float)bezier_basis0._492_4_ +
       fVar13 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar1 + fVar12 * (float)bezier_basis0._3960_4_;
  auVar47._20_4_ =
       fVar14 * (float)bezier_basis0._496_4_ +
       fVar13 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar1 + fVar12 * (float)bezier_basis0._3964_4_;
  auVar47._24_4_ =
       fVar14 * (float)bezier_basis0._500_4_ +
       fVar13 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar1 + fVar12 * (float)bezier_basis0._3968_4_;
  auVar47._28_4_ = auVar8._28_4_ + fVar44;
  auVar43._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6256_4_ +
       fVar12 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar1;
  auVar43._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6260_4_ +
       fVar12 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar1;
  auVar43._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6264_4_ +
       fVar12 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar1;
  auVar43._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6268_4_ +
       fVar12 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._7424_4_ * fVar1;
  auVar43._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6272_4_ +
       fVar12 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar1;
  auVar43._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6276_4_ +
       fVar12 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar1;
  auVar43._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar14 +
       fVar13 * (float)bezier_basis0._6280_4_ +
       fVar12 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar1;
  auVar43._28_4_ = fVar44 + fVar14 + fVar12 + fVar1;
  auVar28 = vblendps_avx(auVar43,ZEXT832(0) << 0x20,1);
  auVar8 = vblendps_avx(auVar43,ZEXT832(0) << 0x20,0x80);
  auVar20._4_4_ = auVar28._4_4_ * 0.055555556;
  auVar20._0_4_ = auVar28._0_4_ * 0.055555556;
  auVar20._8_4_ = auVar28._8_4_ * 0.055555556;
  auVar20._12_4_ = auVar28._12_4_ * 0.055555556;
  auVar20._16_4_ = auVar28._16_4_ * 0.055555556;
  auVar20._20_4_ = auVar28._20_4_ * 0.055555556;
  auVar20._24_4_ = auVar28._24_4_ * 0.055555556;
  auVar20._28_4_ = auVar28._28_4_;
  auVar46._8_4_ = 0xff800000;
  auVar46._0_8_ = 0xff800000ff800000;
  auVar46._12_4_ = 0xff800000;
  auVar46._16_4_ = 0xff800000;
  auVar46._20_4_ = 0xff800000;
  auVar46._24_4_ = 0xff800000;
  auVar46._28_4_ = 0xff800000;
  auVar28 = vmaxps_avx(auVar46,auVar47);
  auVar20 = vsubps_avx(auVar47,auVar20);
  auVar49._0_4_ = auVar47._0_4_ + auVar8._0_4_ * 0.055555556;
  auVar49._4_4_ = auVar47._4_4_ + auVar8._4_4_ * 0.055555556;
  auVar49._8_4_ = auVar47._8_4_ + auVar8._8_4_ * 0.055555556;
  auVar49._12_4_ = auVar47._12_4_ + auVar8._12_4_ * 0.055555556;
  auVar49._16_4_ = auVar47._16_4_ + auVar8._16_4_ * 0.055555556;
  auVar49._20_4_ = auVar47._20_4_ + auVar8._20_4_ * 0.055555556;
  auVar49._24_4_ = auVar47._24_4_ + auVar8._24_4_ * 0.055555556;
  auVar49._28_4_ = auVar47._28_4_ + auVar8._28_4_;
  auVar8 = vmaxps_avx(auVar20,auVar49);
  auVar28 = vmaxps_avx(auVar28,auVar8);
  auVar8 = vminps_avx(auVar40,auVar26);
  auVar53._8_4_ = 0x7f800000;
  auVar53._0_8_ = 0x7f8000007f800000;
  auVar53._12_4_ = 0x7f800000;
  auVar53._16_4_ = 0x7f800000;
  auVar53._20_4_ = 0x7f800000;
  auVar53._24_4_ = 0x7f800000;
  auVar53._28_4_ = 0x7f800000;
  auVar40 = vminps_avx(auVar53,auVar45);
  auVar8 = vminps_avx(auVar40,auVar8);
  auVar40 = vminps_avx(auVar19,auVar34);
  auVar19 = vminps_avx(auVar53,auVar31);
  auVar40 = vminps_avx(auVar19,auVar40);
  auVar19 = vminps_avx(auVar27,auVar36);
  auVar27 = vminps_avx(auVar53,auVar29);
  auVar19 = vminps_avx(auVar27,auVar19);
  auVar27 = vminps_avx(auVar53,auVar47);
  auVar20 = vminps_avx(auVar20,auVar49);
  auVar27 = vminps_avx(auVar27,auVar20);
  auVar20 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar27,auVar20);
  auVar20 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar20);
  auVar33 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar19 = vminps_avx(auVar19,auVar27);
  auVar27 = vshufpd_avx(auVar19,auVar19,5);
  auVar19 = vminps_avx(auVar19,auVar27);
  auVar11 = vminps_avx(auVar19._0_16_,auVar19._16_16_);
  auVar11 = vunpcklps_avx(auVar33,auVar11);
  auVar19 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar40 = vminps_avx(auVar40,auVar19);
  auVar19 = vshufpd_avx(auVar40,auVar40,5);
  auVar40 = vminps_avx(auVar40,auVar19);
  auVar33 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
  auVar6 = vinsertps_avx(auVar11,auVar33,0x28);
  auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar40);
  auVar40 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar40);
  auVar33 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar28 = vmaxps_avx(auVar10,auVar28);
  auVar10 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar10);
  auVar11 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar11 = vunpcklps_avx(auVar33,auVar11);
  auVar28 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar28 = vmaxps_avx(auVar25,auVar28);
  auVar25 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar25);
  auVar33 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar7 = vinsertps_avx(auVar11,auVar33,0x28);
  auVar28 = vshufps_avx(auVar8,auVar8,0xb1);
  auVar28 = vminps_avx(auVar8,auVar28);
  auVar8 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar8);
  auVar33 = vminss_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar28 = vmaxps_avx(auVar9,auVar28);
  auVar8 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar8);
  auVar11 = vmaxss_avx(auVar28._0_16_,auVar28._16_16_);
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar33 = vandps_avx(auVar33,auVar41);
  auVar11 = vandps_avx(auVar11,auVar41);
  auVar33 = vmaxss_avx(auVar11,auVar33);
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  auVar6 = vsubps_avx(auVar6,auVar33);
  auVar30._0_4_ = auVar7._0_4_ + auVar33._0_4_;
  auVar30._4_4_ = auVar7._4_4_ + auVar33._4_4_;
  auVar30._8_4_ = auVar7._8_4_ + auVar33._8_4_;
  auVar30._12_4_ = auVar7._12_4_ + auVar33._12_4_;
  auVar33 = vandps_avx(auVar6,auVar41);
  auVar11 = vandps_avx(auVar30,auVar41);
  auVar33 = vmaxps_avx(auVar33,auVar11);
  auVar11 = vmovshdup_avx(auVar33);
  auVar11 = vmaxss_avx(auVar11,auVar33);
  auVar33 = vshufpd_avx(auVar33,auVar33,1);
  auVar33 = vmaxss_avx(auVar33,auVar11);
  auVar33 = ZEXT416((uint)(auVar33._0_4_ * 4.7683716e-07));
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  aVar18 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar6,auVar33);
  (__return_storage_ptr__->lower).field_0 = aVar18;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar30._0_4_ + auVar33._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar30._4_4_ + auVar33._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar30._8_4_ + auVar33._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar30._12_4_ + auVar33._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }